

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic_intpl.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  ostream *poVar7;
  long in_RSI;
  int in_EDI;
  ostringstream error_message_9;
  ostringstream error_message_8;
  vector<double,_std::allocator<double>_> data;
  ostringstream error_message_7;
  InputSourceFillingMagicNumber input_source_filling_magic_number;
  ostringstream error_message_6;
  InputSourceFromStream input_source;
  istream *input_stream;
  ostringstream error_message_5;
  ifstream ifs;
  ostringstream error_message_4;
  char *input_file;
  ostringstream error_message_3;
  int num_input_files;
  ostringstream error_message_2;
  ostringstream error_message_1;
  ostringstream error_message;
  int option_char;
  option long_options [2];
  double magic_number;
  int vector_length;
  option *in_stack_ffffffffffffeab8;
  InputSourceFillingMagicNumber *in_stack_ffffffffffffeac0;
  string *in_stack_ffffffffffffeac8;
  allocator *paVar8;
  undefined4 in_stack_ffffffffffffead0;
  undefined2 in_stack_ffffffffffffead4;
  undefined1 in_stack_ffffffffffffead6;
  undefined1 in_stack_ffffffffffffead7;
  undefined7 in_stack_ffffffffffffeae0;
  undefined1 in_stack_ffffffffffffeae7;
  undefined7 in_stack_ffffffffffffeaf0;
  InputSourceFillingMagicNumber *pIVar9;
  undefined7 in_stack_ffffffffffffeb00;
  undefined8 in_stack_ffffffffffffeb08;
  undefined8 in_stack_ffffffffffffeb10;
  InputSourceInterface *in_stack_ffffffffffffeb30;
  double in_stack_ffffffffffffeb38;
  ostringstream *this;
  InputSourceFillingMagicNumber *this_00;
  bool local_1462;
  ostringstream *in_stack_ffffffffffffeca8;
  string *in_stack_ffffffffffffecb0;
  allocator local_1281;
  string local_1280 [32];
  ostringstream local_1260 [407];
  allocator local_10c9;
  string local_10c8 [32];
  ostringstream local_10a8 [376];
  InputSourceFillingMagicNumber local_f30;
  allocator local_e89;
  string local_e88 [32];
  ostringstream local_e68 [376];
  InputSourceFromStream local_cf0;
  InputSourceFillingMagicNumber *local_cd0;
  undefined4 local_cc8;
  allocator local_cc1;
  string local_cc0 [32];
  ostringstream local_ca0 [376];
  InputSourceFillingMagicNumber local_b28 [3];
  allocator local_919;
  string local_918 [32];
  ostringstream local_8f8 [376];
  InputSourceFillingMagicNumber *local_780;
  allocator local_771;
  string local_770 [32];
  ostringstream local_750 [376];
  int local_5d8;
  allocator local_5d1;
  string local_5d0 [32];
  ostringstream local_5b0 [383];
  allocator local_431;
  string local_430 [39];
  allocator local_409;
  string local_408 [32];
  ostringstream local_3e8 [383];
  allocator local_269;
  string local_268 [39];
  allocator local_241;
  string local_240 [32];
  ostringstream local_220 [399];
  allocator local_91;
  string local_90 [36];
  int local_6c;
  undefined1 local_68 [72];
  undefined8 local_20;
  int local_14;
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_14 = 1;
  local_20 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  memcpy(local_68,&PTR_anon_var_dwarf_1c28_0012abb0,0x40);
  while (local_6c = ya_getopt_long_only(CONCAT13(in_stack_ffffffffffffead7,
                                                 CONCAT12(in_stack_ffffffffffffead6,
                                                          in_stack_ffffffffffffead4)),
                                        (char **)in_stack_ffffffffffffeac8,
                                        (char *)in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,
                                        (int *)0x103799), pcVar1 = ya_optarg, local_6c != -1) {
    if (local_6c == 0x68) {
      anon_unknown.dwarf_1be7::PrintUsage
                ((ostream *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
      return 0;
    }
    if (local_6c == 0x6c) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_90,pcVar1,&local_91);
      bVar2 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffeac8,(int *)in_stack_ffffffffffffeac0);
      bVar3 = local_14 < 1;
      std::__cxx11::string::~string(local_90);
      std::allocator<char>::~allocator((allocator<char> *)&local_91);
      if (!bVar2 || bVar3) {
        std::__cxx11::ostringstream::ostringstream(local_220);
        std::operator<<((ostream *)local_220,
                        "The argument for the -l option must be a positive integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_240,"magic_intpl",&local_241);
        sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator((allocator<char> *)&local_241);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_220);
        return local_4;
      }
    }
    else if (local_6c == 0x6d) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_268,pcVar1,&local_269);
      bVar3 = sptk::ConvertStringToInteger
                        (in_stack_ffffffffffffeac8,(int *)in_stack_ffffffffffffeac0);
      local_1462 = !bVar3 || local_14 < 0;
      std::__cxx11::string::~string(local_268);
      std::allocator<char>::~allocator((allocator<char> *)&local_269);
      if (local_1462) {
        std::__cxx11::ostringstream::ostringstream(local_3e8);
        poVar7 = std::operator<<((ostream *)local_3e8,"The argument for the -m option must be a ");
        std::operator<<(poVar7,"non-negative integer");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_408,"magic_intpl",&local_409);
        sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
        std::__cxx11::string::~string(local_408);
        std::allocator<char>::~allocator((allocator<char> *)&local_409);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_3e8);
        return local_4;
      }
      local_14 = local_14 + 1;
    }
    else {
      if (local_6c != 1000) {
        anon_unknown.dwarf_1be7::PrintUsage
                  ((ostream *)CONCAT17(in_stack_ffffffffffffeae7,in_stack_ffffffffffffeae0));
        return 1;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_430,pcVar1,&local_431);
      bVar3 = sptk::ConvertStringToDouble
                        (in_stack_ffffffffffffeac8,(double *)in_stack_ffffffffffffeac0);
      std::__cxx11::string::~string(local_430);
      std::allocator<char>::~allocator((allocator<char> *)&local_431);
      if (((bVar3 ^ 0xffU) & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream(local_5b0);
        std::operator<<((ostream *)local_5b0,"The argument for the -magic option must be a number");
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_5d0,"magic_intpl",&local_5d1);
        sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
        std::__cxx11::string::~string(local_5d0);
        std::allocator<char>::~allocator((allocator<char> *)&local_5d1);
        local_4 = 1;
        std::__cxx11::ostringstream::~ostringstream(local_5b0);
        return local_4;
      }
    }
  }
  local_5d8 = local_8 - ya_optind;
  if (1 < local_5d8) {
    std::__cxx11::ostringstream::ostringstream(local_750);
    std::operator<<((ostream *)local_750,"Too many input files");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_770,"magic_intpl",&local_771);
    sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
    std::__cxx11::string::~string(local_770);
    std::allocator<char>::~allocator((allocator<char> *)&local_771);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_750);
    return local_4;
  }
  if (local_5d8 == 0) {
    this_00 = (InputSourceFillingMagicNumber *)0x0;
  }
  else {
    this_00 = *(InputSourceFillingMagicNumber **)(local_10 + (long)ya_optind * 8);
  }
  local_780 = this_00;
  bVar3 = sptk::SetBinaryMode();
  if (!bVar3) {
    this = local_8f8;
    std::__cxx11::ostringstream::ostringstream(this);
    std::operator<<((ostream *)this,"Cannot set translation mode");
    paVar8 = &local_919;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_918,"magic_intpl",paVar8);
    sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
    std::__cxx11::string::~string(local_918);
    std::allocator<char>::~allocator((allocator<char> *)&local_919);
    local_4 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_8f8);
    return local_4;
  }
  std::ifstream::ifstream(local_b28);
  pIVar9 = local_780;
  if (local_780 != (InputSourceFillingMagicNumber *)0x0) {
    std::operator|(_S_in,_S_bin);
    std::ifstream::open((char *)local_b28,(_Ios_Openmode)pIVar9);
    bVar4 = std::ios::fail();
    if ((bVar4 & 1) != 0) {
      std::__cxx11::ostringstream::ostringstream(local_ca0);
      poVar7 = std::operator<<((ostream *)local_ca0,"Cannot open file ");
      std::operator<<(poVar7,(char *)local_780);
      paVar8 = &local_cc1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_cc0,"magic_intpl",paVar8);
      sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
      std::__cxx11::string::~string(local_cc0);
      std::allocator<char>::~allocator((allocator<char> *)&local_cc1);
      local_4 = 1;
      local_cc8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_ca0);
      goto LAB_001049cd;
    }
  }
  bVar4 = std::ifstream::is_open();
  if ((bVar4 & 1) == 0) {
    pIVar9 = (InputSourceFillingMagicNumber *)&std::cin;
  }
  else {
    pIVar9 = local_b28;
  }
  local_cd0 = pIVar9;
  sptk::InputSourceFromStream::InputSourceFromStream
            ((InputSourceFromStream *)
             CONCAT17(in_stack_ffffffffffffead7,
                      CONCAT16(in_stack_ffffffffffffead6,
                               CONCAT24(in_stack_ffffffffffffead4,in_stack_ffffffffffffead0))),
             SUB81((ulong)in_stack_ffffffffffffeac8 >> 0x38,0),(int)in_stack_ffffffffffffeac8,
             (istream *)in_stack_ffffffffffffeac0);
  uVar5 = sptk::InputSourceFromStream::IsValid(&local_cf0);
  if ((bool)uVar5) {
    sptk::InputSourceFillingMagicNumber::InputSourceFillingMagicNumber
              (this_00,in_stack_ffffffffffffeb38,in_stack_ffffffffffffeb30);
    bVar3 = sptk::InputSourceFillingMagicNumber::IsValid(&local_f30);
    if (bVar3) {
      std::vector<double,_std::allocator<double>_>::vector
                ((vector<double,_std::allocator<double>_> *)0x10466f);
      do {
        uVar6 = sptk::InputSourceFillingMagicNumber::Get
                          (pIVar9,(vector<double,_std::allocator<double>_> *)
                                  CONCAT17(uVar5,in_stack_ffffffffffffeaf0));
        if (!(bool)uVar6) {
          local_4 = 0;
          local_cc8 = 1;
          goto LAB_00104973;
        }
        in_stack_ffffffffffffead6 =
             sptk::WriteStream<double>
                       ((int)in_stack_ffffffffffffeb10,
                        (int)((ulong)in_stack_ffffffffffffeb08 >> 0x20),
                        (vector<double,_std::allocator<double>_> *)
                        CONCAT17(bVar4,in_stack_ffffffffffffeb00),(ostream *)pIVar9,
                        (int *)CONCAT17(uVar5,in_stack_ffffffffffffeaf0));
      } while ((bool)in_stack_ffffffffffffead6);
      std::__cxx11::ostringstream::ostringstream(local_1260);
      std::operator<<((ostream *)local_1260,"Failed to write interpolated data");
      paVar8 = &local_1281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1280,"magic_intpl",paVar8);
      sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
      std::__cxx11::string::~string(local_1280);
      std::allocator<char>::~allocator((allocator<char> *)&local_1281);
      local_4 = 1;
      local_cc8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_1260);
LAB_00104973:
      std::vector<double,_std::allocator<double>_>::~vector
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT17(uVar6,CONCAT16(in_stack_ffffffffffffead6,
                                         CONCAT24(in_stack_ffffffffffffead4,
                                                  in_stack_ffffffffffffead0))));
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_10a8);
      std::operator<<((ostream *)local_10a8,"Failed to initialize InputSourceFillingMagicNumber");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_10c8,"magic_intpl",&local_10c9);
      sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
      std::__cxx11::string::~string(local_10c8);
      std::allocator<char>::~allocator((allocator<char> *)&local_10c9);
      local_4 = 1;
      local_cc8 = 1;
      std::__cxx11::ostringstream::~ostringstream(local_10a8);
    }
    sptk::InputSourceFillingMagicNumber::~InputSourceFillingMagicNumber(in_stack_ffffffffffffeac0);
  }
  else {
    std::__cxx11::ostringstream::ostringstream(local_e68);
    std::operator<<((ostream *)local_e68,"Failed to initialize InputSourceFromStream");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e88,"magic_intpl",&local_e89);
    sptk::PrintErrorMessage(in_stack_ffffffffffffecb0,in_stack_ffffffffffffeca8);
    std::__cxx11::string::~string(local_e88);
    std::allocator<char>::~allocator((allocator<char> *)&local_e89);
    local_4 = 1;
    local_cc8 = 1;
    std::__cxx11::ostringstream::~ostringstream(local_e68);
  }
  sptk::InputSourceFromStream::~InputSourceFromStream((InputSourceFromStream *)0x1049bc);
LAB_001049cd:
  std::ifstream::~ifstream(local_b28);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
  int vector_length(kDefaultVectorLength);
  double magic_number(kDefaultMagicNumber);

  const struct option long_options[] = {
      {"magic", required_argument, NULL, kMagic},
      {0, 0, 0, 0},
  };

  for (;;) {
    const int option_char(
        getopt_long_only(argc, argv, "l:m:h", long_options, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'l': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length <= 0) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -l option must be a positive integer";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        break;
      }
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &vector_length) ||
            vector_length < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        ++vector_length;
        break;
      }
      case kMagic: {
        if (!sptk::ConvertStringToDouble(optarg, &magic_number)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -magic option must be a number";
          sptk::PrintErrorMessage("magic_intpl", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("magic_intpl", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::InputSourceFromStream input_source(false, vector_length, &input_stream);
  if (!input_source.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFromStream";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  sptk::InputSourceFillingMagicNumber input_source_filling_magic_number(
      magic_number, &input_source);
  if (!input_source_filling_magic_number.IsValid()) {
    std::ostringstream error_message;
    error_message << "Failed to initialize InputSourceFillingMagicNumber";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  std::vector<double> data;
  try {
    while (input_source_filling_magic_number.Get(&data)) {
      if (!sptk::WriteStream(0, vector_length, data, &std::cout, NULL)) {
        std::ostringstream error_message;
        error_message << "Failed to write interpolated data";
        sptk::PrintErrorMessage("magic_intpl", error_message);
        return 1;
      }
    }
  } catch (...) {
    std::ostringstream error_message;
    error_message << "Cannot interpolate data";
    sptk::PrintErrorMessage("magic_intpl", error_message);
    return 1;
  }

  return 0;
}